

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

Gia_ObjType_t Gia_ManEncodeFanout(Gia_Man_t *p,Gia_Obj_t *pObj,int i)

{
  int iVar1;
  Gia_ObjType_t GVar2;
  
  iVar1 = Gia_ObjIsPo(p,pObj);
  if (iVar1 == 0) {
    if ((int)*(uint *)pObj < 0 && (~*(uint *)pObj & 0x1fffffff) != 0) {
      GVar2 = oFF;
    }
    else {
      iVar1 = Gia_ObjIsXor(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsMux(p,pObj);
        if (iVar1 == 0) {
          if (((int)(uint)*(undefined8 *)pObj < 0) ||
             (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMuxes.c"
                          ,0x2c2,"Gia_ObjType_t Gia_ManEncodeFanout(Gia_Man_t *, Gia_Obj_t *, int)")
            ;
          }
          GVar2 = oAND;
        }
        else {
          GVar2 = (i != 2) + oMUXc;
        }
      }
      else {
        GVar2 = oXOR;
      }
    }
  }
  else {
    GVar2 = oPO;
  }
  return GVar2;
}

Assistant:

Gia_ObjType_t Gia_ManEncodeFanout( Gia_Man_t * p, Gia_Obj_t * pObj, int i )
{
//    int iLit;
    if ( Gia_ObjIsPo(p, pObj) )
        return oPO;
    if ( Gia_ObjIsCo(pObj) )
        return oFF;
    if ( Gia_ObjIsXor(pObj) )
        return oXOR;
    if ( Gia_ObjIsMux(p, pObj) )
        return i == 2 ? oMUXc : oMUXd;
    assert( Gia_ObjIsAnd(pObj) );
    return oAND;
//    iLit = i ? Gia_ObjFaninLit1p(p, pObj) : Gia_ObjFaninLit0p(p, pObj);
//    if ( Abc_LitIsCompl(iLit) )
//        return oANDn;
//    else
//        return oANDp;
}